

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O2

subset_iterator<const_int_*,_std::less<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
* __thiscall
burst::make_subset_iterator<std::initializer_list<int>&>
          (subset_iterator<const_int_*,_std::less<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
           *__return_storage_ptr__,burst *this,initializer_list<int> *range)

{
  subset_iterator<const_int_*,_std::less<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  ::subset_iterator(__return_storage_ptr__,*(long *)this,*(long *)this + *(long *)(this + 8) * 4);
  return __return_storage_ptr__;
}

Assistant:

auto make_subset_iterator (ForwardRange && range)
    {
        using std::begin;
        using std::end;
        return
            make_subset_iterator
            (
                begin(std::forward<ForwardRange>(range)),
                end(std::forward<ForwardRange>(range))
            );
    }